

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManFree(Mf_Man_t *p)

{
  int *piVar1;
  void **__ptr;
  void *__ptr_00;
  int i;
  int i_00;
  
  if ((p->pPars->fGenCnf != 0) && ((p->vCnfSizes).nSize != p->vTtMem->nEntries)) {
    __assert_fail("!p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x585,"void Mf_ManFree(Mf_Man_t *)");
  }
  if (p->pPars->fCutMin != 0) {
    Vec_MemHashFree(p->vTtMem);
    if (p->pPars->fCutMin != 0) {
      Vec_MemFree(p->vTtMem);
    }
  }
  for (i_00 = 0; i_00 < (p->vPages).nSize; i_00 = i_00 + 1) {
    __ptr_00 = Vec_PtrEntry(&p->vPages,i_00);
    if ((void *)0x2 < __ptr_00) {
      free(__ptr_00);
    }
  }
  piVar1 = (p->vCnfSizes).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCnfSizes).pArray = (int *)0x0;
  }
  piVar1 = (p->vCnfMem).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCnfMem).pArray = (int *)0x0;
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vTemp).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTemp).pArray = (int *)0x0;
  }
  free(p->pLfObjs);
  free(p);
  return;
}

Assistant:

void Mf_ManFree( Mf_Man_t * p )
{
    assert( !p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem) );
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vCnfSizes.pArray );
    ABC_FREE( p->vCnfMem.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vTemp.pArray );
    ABC_FREE( p->pLfObjs );
    ABC_FREE( p );
}